

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable.hpp
# Opt level: O0

range_type * __thiscall cs_impl::any::const_val<cs::range_type>(any *this)

{
  bool bVar1;
  undefined8 uVar2;
  error *this_00;
  range_type *prVar3;
  long *in_RDI;
  string *in_stack_ffffffffffffff68;
  error *in_stack_ffffffffffffff70;
  allocator local_61;
  string local_60 [35];
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  type((any *)in_stack_ffffffffffffff70);
  bVar1 = std::type_info::operator!=
                    ((type_info *)in_stack_ffffffffffffff70,(type_info *)in_stack_ffffffffffffff68);
  if (bVar1) {
    local_3d = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_28,"E0006",&local_29);
    cov::error::error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    local_3d = 0;
    __cxa_throw(uVar2,&cov::error::typeinfo,cov::error::~error);
  }
  if (*in_RDI == 0) {
    this_00 = (error *)__cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_60,"E0005",&local_61);
    cov::error::error(this_00,in_stack_ffffffffffffff68);
    __cxa_throw(this_00,&cov::error::typeinfo,cov::error::~error);
  }
  prVar3 = holder<cs::range_type>::data(*(holder<cs::range_type> **)(*in_RDI + 0x10));
  return prVar3;
}

Assistant:

const T &const_val() const
		{
			if (typeid(T) != this->type())
				throw cov::error("E0006");
			if (this->mDat == nullptr)
				throw cov::error("E0005");
			return static_cast<holder<T> *>(this->mDat->data)->data();
		}